

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-swap4.h
# Opt level: O0

void swap4(void *value)

{
  uchar *v;
  void *value_local;
  
  *(byte *)value = *value ^ *(byte *)((long)value + 3);
  *(byte *)((long)value + 3) = *value ^ *(byte *)((long)value + 3);
  *(byte *)value = *value ^ *(byte *)((long)value + 3);
  *(byte *)((long)value + 1) = *(byte *)((long)value + 1) ^ *(byte *)((long)value + 2);
  *(byte *)((long)value + 2) = *(byte *)((long)value + 1) ^ *(byte *)((long)value + 2);
  *(byte *)((long)value + 1) = *(byte *)((long)value + 1) ^ *(byte *)((long)value + 2);
  return;
}

Assistant:

static void swap4(void *value)
{
    unsigned char *v = (unsigned char *)value;

    /* use XOR swap algorithm to swap bytes 0/3 and 1/2 */
    v[0] = v[0] ^ v[3];
    v[3] = v[0] ^ v[3];
    v[0] = v[0] ^ v[3];
    v[1] = v[1] ^ v[2];
    v[2] = v[1] ^ v[2];
    v[1] = v[1] ^ v[2];
}